

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase *
EvaluateVariableDefinitions(ExpressionEvalContext *ctx,ExprVariableDefinitions *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  int iVar4;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    pEVar6 = (expression->definitions).head;
    while( true ) {
      if (pEVar6 == (ExprBase *)0x0) {
        pAVar1 = ctx->ctx->allocator;
        iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
        pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar4);
        pSVar2 = (expression->super_ExprBase).source;
        pTVar3 = ctx->ctx->typeVoid;
        pEVar6->typeID = 2;
        pEVar6->source = pSVar2;
        pEVar6->type = pTVar3;
        pEVar6->next = (ExprBase *)0x0;
        pEVar6->listed = false;
        pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223698;
        pEVar6 = CheckType(&expression->super_ExprBase,pEVar6);
        return pEVar6;
      }
      pEVar5 = Evaluate(ctx,pEVar6);
      if (pEVar5 == (ExprBase *)0x0) break;
      pEVar6 = pEVar6->next;
    }
  }
  else {
    Report(ctx,"ERROR: instruction limit reached");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateVariableDefinitions(ExpressionEvalContext &ctx, ExprVariableDefinitions *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	for(ExprBase *definition = expression->definitions.head; definition; definition = definition->next)
	{
		if(!Evaluate(ctx, definition))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}